

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O2

BOOL temp_use_consistent(List *code,Token *one_use)

{
  BOOL BVar1;
  
  do {
    if (code == (List *)0x0) {
      return TRUE;
    }
    if (((code->token).type == TOK_TEMP_REGISTER) &&
       ((code->token).u.reginfo.which == (one_use->u).reginfo.which)) {
      if ((code->token).u.reginfo.sgnd != (one_use->u).reginfo.sgnd) {
        return FALSE;
      }
      if ((code->token).u.reginfo.size != (one_use->u).reginfo.size) {
        return FALSE;
      }
    }
    BVar1 = temp_use_consistent(code->car,one_use);
    if (BVar1 == FALSE) {
      return FALSE;
    }
    code = code->cdr;
  } while( true );
}

Assistant:

static BOOL
temp_use_consistent (List *code, Token *one_use)
{
  Token *t;

  /* Recursion base case. */
  if (code == NULL)
    return TRUE;

  /* If this is a usage of the specified temp reg, see if it is used in
   * the same way as ONE_USE.
   */
  t = &code->token;
  if (t->type == TOK_TEMP_REGISTER
      && t->u.reginfo.which == one_use->u.reginfo.which)
    {
      if (t->u.reginfo.sgnd != one_use->u.reginfo.sgnd
	  || t->u.reginfo.size != one_use->u.reginfo.size)
	return FALSE;
    }

  /* Recurse. */
  return (temp_use_consistent (code->car, one_use)
	  && temp_use_consistent (code->cdr, one_use));
}